

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall
sim_combinational_order_wrong_Test::TestBody(sim_combinational_order_wrong_Test *this)

{
  undefined1 *this_00;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  undefined1 var [8];
  bool bVar1;
  int iVar2;
  Generator *pGVar3;
  Var *pVVar4;
  StmtBlock *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *message;
  char *in_R9;
  optional<unsigned_long> oVar6;
  string local_520;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_;
  optional<unsigned_long> res;
  unsigned_long local_4c0;
  iterator local_4b8;
  size_type local_4b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4a8;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_490;
  undefined4 local_46c;
  undefined1 local_468 [4];
  uint32_t value;
  Simulator sim;
  shared_ptr<kratos::Stmt> local_2b0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  shared_ptr<kratos::CombinationalStmtBlock> comb;
  string local_268;
  undefined1 local_248 [8];
  Var *c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_238;
  pointer local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_220;
  allocator<char> local_201;
  string local_200;
  Var *local_1e0;
  Var *b;
  __node_base_ptr local_1d0;
  __node_base_ptr *local_1c8;
  size_type local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  allocator<char> local_199;
  string local_198;
  Var *local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context context;
  sim_combinational_order_wrong_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar3 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"a",&local_199);
  local_1d0._0_4_ = 2;
  local_1d0._4_4_ = 2;
  local_1c8 = &local_1d0;
  local_1c0 = 2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&b + 7));
  __l_01._M_len = local_1c0;
  __l_01._M_array = (iterator)local_1c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1b8,__l_01,(allocator<unsigned_int> *)((long)&b + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_198,4,&local_1b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1b8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&b + 7));
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pGVar3 = local_138;
  local_178 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"b",&local_201);
  local_238._M_allocated_capacity._0_4_ = 2;
  local_238._M_allocated_capacity._4_4_ = 2;
  local_238._8_8_ = &local_238;
  local_228 = (pointer)0x2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&c + 7));
  __l_00._M_len = (size_type)local_228;
  __l_00._M_array = (iterator)local_238._8_8_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_220,__l_00,(allocator<unsigned_int> *)((long)&c + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_200,4,&local_220);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_220);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&c + 7));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  pGVar3 = local_138;
  local_1e0 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"c",
             (allocator<char> *)
             ((long)&comb.
                     super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_268,4);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&comb.
                     super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_248 = (undefined1  [8])pVVar4;
  kratos::Generator::combinational((Generator *)local_280);
  pSVar5 = &std::
            __shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_280)->super_StmtBlock;
  var = local_248;
  iVar2 = (*(local_178->super_IRNode)._vptr_IRNode[9])(local_178,1);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x48))
            ((long *)CONCAT44(extraout_var,iVar2),1);
  kratos::Var::assign((Var *)local_2a0,(Var *)var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_2a0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_2a0);
  kratos::StmtBlock::add_stmt(pSVar5,(shared_ptr<kratos::Stmt> *)(local_2a0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_2a0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_2a0);
  pSVar5 = &std::
            __shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_280)->super_StmtBlock;
  kratos::Var::assign((Var *)&sim.simulation_depth_,local_178);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_2b0,(shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::StmtBlock::add_stmt(pSVar5,&local_2b0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_2b0);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Simulator::Simulator((Simulator *)local_468,local_138);
  local_46c = 5;
  iVar2 = (*(local_1e0->super_IRNode)._vptr_IRNode[9])(local_1e0,1);
  pVVar4 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x48))
                            ((long *)CONCAT44(extraout_var_00,iVar2),1);
  local_4c0 = 5;
  local_4b8 = &local_4c0;
  local_4b0 = 1;
  this_00 = &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>.field_0xf;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this_00);
  __l._M_len = local_4b0;
  __l._M_array = local_4b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_4a8,__l,(allocator_type *)this_00);
  std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>(&local_490,&local_4a8);
  kratos::Simulator::set((Simulator *)local_468,pVVar4,&local_490,true);
  std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional(&local_490);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_4a8);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>.field_0xf);
  oVar6 = kratos::Simulator::get((Simulator *)local_468,(Var *)local_248);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_4e9 = std::operator==(&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_520,(internal *)local_4e8,(AssertionResult *)"res == std::nullopt","false",
               "true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x5f,message);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    std::__cxx11::string::~string((string *)&local_520);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  kratos::Simulator::~Simulator((Simulator *)local_468);
  std::shared_ptr<kratos::CombinationalStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::CombinationalStmtBlock> *)local_280);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(sim, combinational_order_wrong) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 4, {2, 2});
    auto &b = mod.var("b", 4, {2, 2});
    auto &c = mod.var("c", 4);
    auto comb = mod.combinational();
    comb->add_stmt(c.assign(a[1][1]));
    comb->add_stmt(a.assign(b));

    Simulator sim(&mod);
    uint32_t constexpr value = 5;
    sim.set(&(b[1][1]), std::vector<uint64_t>{value});

    auto res = sim.get(&c);
    EXPECT_TRUE(res == std::nullopt);
}